

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_container_unit.c
# Opt level: O0

void to_uint32_array_test(void)

{
  run_container_t *result;
  int k_1;
  int nc;
  uint32_t *out;
  int card;
  int k;
  run_container_t *B;
  size_t offset;
  int in_stack_ffffffffffffffd8;
  uint32_t in_stack_ffffffffffffffdc;
  run_container_t *in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  undefined8 local_8;
  
  for (local_8 = 1; local_8 < 0x80; local_8 = local_8 << 1) {
    result = run_container_create();
    _assert_true((unsigned_long)result,
                 (char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                 (char *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
    for (in_stack_ffffffffffffffec = 0; in_stack_ffffffffffffffec < 0x10000;
        in_stack_ffffffffffffffec = in_stack_ffffffffffffffec + (int)local_8) {
      run_container_add((run_container_t *)
                        CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                        (uint16_t)((ulong)in_stack_ffffffffffffffe0 >> 0x30));
    }
    in_stack_ffffffffffffffe8 =
         run_container_cardinality
                   ((run_container_t *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)
                   );
    in_stack_ffffffffffffffe0 = (run_container_t *)malloc((long)in_stack_ffffffffffffffe8 << 2);
    in_stack_ffffffffffffffdc =
         run_container_to_uint32_array
                   ((void *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                    in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
    _assert_int_equal((unsigned_long)result,
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
    for (in_stack_ffffffffffffffd8 = 1; in_stack_ffffffffffffffd8 < (int)in_stack_ffffffffffffffdc;
        in_stack_ffffffffffffffd8 = in_stack_ffffffffffffffd8 + 1) {
      _assert_int_equal((unsigned_long)result,
                        CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                        (char *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
    }
    free(in_stack_ffffffffffffffe0);
    run_container_free((run_container_t *)0x1036d1);
  }
  return;
}

Assistant:

DEFINE_TEST(to_uint32_array_test) {
    for (size_t offset = 1; offset < 128; offset *= 2) {
        run_container_t* B = run_container_create();
        assert_non_null(B);

        for (int k = 0; k < (1 << 16); k += offset) {
            run_container_add(B, k);
        }

        int card = run_container_cardinality(B);
        uint32_t* out = (uint32_t*)malloc(sizeof(uint32_t) * card);
        int nc = run_container_to_uint32_array(out, B, 0);
        assert_int_equal(nc, card);

        for (int k = 1; k < nc; ++k) {
            assert_int_equal(out[k], offset + out[k - 1]);
        }

        free(out);
        run_container_free(B);
    }
}